

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall
VarianceEstimator_VsClosedForm_Test::TestBody(VarianceEstimator_VsClosedForm_Test *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  Float FVar6;
  double dVar7;
  undefined1 auVar9 [16];
  double dVar8;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Stratified1DIter __begin1;
  double local_68;
  double local_60;
  Float err;
  Stratified1DIter __end1;
  AssertionResult gtest_ar;
  
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0x27;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::begin
            (&__begin1,
             (IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)&gtest_ar);
  pbrt::detail::IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter>::end
            (&__end1,(IndexingGenerator<pbrt::Stratified1D,_pbrt::detail::Stratified1DIter> *)
                     &gtest_ar);
  dVar8 = 0.0;
  uVar4 = 0;
  local_60 = 0.0;
  local_68 = 0.0;
  iVar2 = __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
          super_IndexingIterator<pbrt::detail::Stratified1DIter>.i;
  while (iVar2 != __end1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
                  super_IndexingIterator<pbrt::detail::Stratified1DIter>.i) {
    FVar6 = pbrt::detail::Stratified1DIter::operator*(&__begin1);
    uVar4 = uVar4 + 1;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar8;
    iVar2 = __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
            super_IndexingIterator<pbrt::detail::Stratified1DIter>.i + 1;
    __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
    super_IndexingIterator<pbrt::detail::Stratified1DIter>.i = iVar2;
    dVar7 = (double)(FVar6 - (1.0 - FVar6));
    dVar8 = dVar7 - local_60;
    local_60 = local_60 + dVar8 / (double)(long)uVar4;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar8;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar7 - local_60;
    auVar5 = vfmadd231sd_fma(auVar13,auVar11,auVar12);
    dVar8 = auVar5._0_8_;
    local_68 = local_68 + dVar7;
  }
  __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.i = -0x2d0e5604;
  __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.n = 0x3f50624d;
  dVar7 = (double)((ulong)(1 < uVar4) * (long)(dVar8 / (double)(long)(uVar4 - 1)));
  dVar8 = dVar7 + -0.3333333333333333;
  auVar9._0_4_ = (float)dVar8;
  auVar9._4_4_ = (int)((ulong)dVar8 >> 0x20);
  auVar9._8_8_ = 0;
  auVar5._8_4_ = 0x7fffffff;
  auVar5._0_8_ = 0x7fffffff7fffffff;
  auVar5._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx512vl(auVar9,auVar5);
  err = auVar5._0_4_;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&gtest_ar,"err","1e-3",&err,(double *)&__begin1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&__begin1);
    std::ostream::_M_insert<double>(dVar7);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__end1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x3a8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__end1,(Message *)&__begin1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__end1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&__begin1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.i = -0x771c970f;
  __begin1.super_RNGIterator<pbrt::detail::Stratified1DIter>.
  super_IndexingIterator<pbrt::detail::Stratified1DIter>.n = 0x3ee4f8b5;
  dVar8 = (local_68 / 10000.0 - local_60) / (local_68 / 10000.0);
  auVar10._0_4_ = (float)dVar8;
  auVar10._4_4_ = (int)((ulong)dVar8 >> 0x20);
  auVar10._8_8_ = 0;
  auVar1._8_4_ = 0x7fffffff;
  auVar1._0_8_ = 0x7fffffff7fffffff;
  auVar1._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx512vl(auVar10,auVar1);
  err = auVar5._0_4_;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)&gtest_ar,"err","1e-5",&err,(double *)&__begin1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&__begin1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__end1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
               ,0x3ab,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__end1,(Message *)&__begin1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__end1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&__begin1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(VarianceEstimator, VsClosedForm) {
    VarianceEstimator<double> ve;
    int count = 10000;
    double sum = 0;
    for (Float u : Stratified1D(count)) {
        Float v = Lerp(u, -1, 1);
        ve.Add(v);
        sum += v;
    }

    // f(x) = 0, random variables x_i uniform in [-1,1] ->
    // variance is E[x^2] on [-1,1] == 1/3
    Float err = std::abs(ve.Variance() - 1. / 3.);
    EXPECT_LT(err, 1e-3) << ve.Variance();

    err = std::abs((sum / count - ve.Mean()) / (sum / count));
    EXPECT_LT(err, 1e-5);
}